

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Value * __thiscall
Json::ValueIteratorBase::key(Value *__return_storage_ptr__,ValueIteratorBase *this)

{
  bool bVar1;
  uint uVar2;
  reference other;
  char *pcVar3;
  char *pcVar4;
  int __c;
  StaticString local_40 [3];
  undefined1 local_28 [8];
  CZString czstring;
  ValueIteratorBase *this_local;
  
  czstring._8_8_ = this;
  other = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                    (&this->current_);
  Value::CZString::CZString((CZString *)local_28,&other->first);
  pcVar3 = Value::CZString::data((CZString *)local_28);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = Value::CZString::index((CZString *)local_28,(char *)other,__c);
    Value::Value(__return_storage_ptr__,(UInt)pcVar3);
  }
  else {
    bVar1 = Value::CZString::isStaticString((CZString *)local_28);
    if (bVar1) {
      pcVar3 = Value::CZString::data((CZString *)local_28);
      StaticString::StaticString(local_40,pcVar3);
      Value::Value(__return_storage_ptr__,local_40);
    }
    else {
      pcVar3 = Value::CZString::data((CZString *)local_28);
      pcVar4 = Value::CZString::data((CZString *)local_28);
      uVar2 = Value::CZString::length((CZString *)local_28);
      Value::Value(__return_storage_ptr__,pcVar3,pcVar4 + uVar2);
    }
  }
  Value::CZString::~CZString((CZString *)local_28);
  return __return_storage_ptr__;
}

Assistant:

Value ValueIteratorBase::key() const {
  const Value::CZString czstring = (*current_).first;
  if (czstring.data()) {
    if (czstring.isStaticString())
      return Value(StaticString(czstring.data()));
    return Value(czstring.data(), czstring.data() + czstring.length());
  }
  return Value(czstring.index());
}